

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall wallet::WalletBatch::EraseTx(WalletBatch *this,uint256 hash)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_60.first.field_2;
  local_60.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,DBKeys::TX_abi_cxx11_,DAT_00b26b28 + DBKeys::TX_abi_cxx11_);
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x10] =
       hash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x11] =
       hash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x12] =
       hash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x13] =
       hash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x14] =
       hash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x15] =
       hash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x16] =
       hash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x17] =
       hash.super_base_blob<256U>.m_data._M_elems[0x17];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x18] =
       hash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x19] =
       hash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x1a] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x1b] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x1c] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x1d] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x1e] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0x1f] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0] =
       hash.super_base_blob<256U>.m_data._M_elems[0];
  local_60.second.super_base_blob<256U>.m_data._M_elems[1] =
       hash.super_base_blob<256U>.m_data._M_elems[1];
  local_60.second.super_base_blob<256U>.m_data._M_elems[2] =
       hash.super_base_blob<256U>.m_data._M_elems[2];
  local_60.second.super_base_blob<256U>.m_data._M_elems[3] =
       hash.super_base_blob<256U>.m_data._M_elems[3];
  local_60.second.super_base_blob<256U>.m_data._M_elems[4] =
       hash.super_base_blob<256U>.m_data._M_elems[4];
  local_60.second.super_base_blob<256U>.m_data._M_elems[5] =
       hash.super_base_blob<256U>.m_data._M_elems[5];
  local_60.second.super_base_blob<256U>.m_data._M_elems[6] =
       hash.super_base_blob<256U>.m_data._M_elems[6];
  local_60.second.super_base_blob<256U>.m_data._M_elems[7] =
       hash.super_base_blob<256U>.m_data._M_elems[7];
  local_60.second.super_base_blob<256U>.m_data._M_elems[8] =
       hash.super_base_blob<256U>.m_data._M_elems[8];
  local_60.second.super_base_blob<256U>.m_data._M_elems[9] =
       hash.super_base_blob<256U>.m_data._M_elems[9];
  local_60.second.super_base_blob<256U>.m_data._M_elems[10] =
       hash.super_base_blob<256U>.m_data._M_elems[10];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0xb] =
       hash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0xc] =
       hash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0xd] =
       hash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0xe] =
       hash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_60.second.super_base_blob<256U>.m_data._M_elems[0xf] =
       hash.super_base_blob<256U>.m_data._M_elems[0xf];
  bVar2 = EraseIC<std::pair<std::__cxx11::string,uint256>>(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseTx(uint256 hash)
{
    return EraseIC(std::make_pair(DBKeys::TX, hash));
}